

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O2

bool __thiscall HighsCutGeneration::separateLiftedMixedBinaryCover(HighsCutGeneration *this)

{
  HighsCDouble *b;
  double dVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  double *pdVar2;
  uint uVar3;
  uint uVar4;
  int bad_allowed;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  HighsInt i;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  HighsCDouble HVar17;
  HighsCDouble local_98;
  HighsCDouble local_88;
  HighsCDouble local_78;
  vector<double,_std::allocator<double>_> S;
  vector<unsigned_char,_std::allocator<unsigned_char>_> coverflag;
  
  this->integralSupport = false;
  this->integralCoefficients = false;
  uVar11 = (ulong)((long)(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  S.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  S.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  S.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar10 = (int)uVar11;
  std::vector<double,_std::allocator<double>_>::resize(&S,(long)iVar10);
  coverflag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  coverflag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  coverflag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&coverflag,(long)this->rowlen);
  if (iVar10 != 0) {
    uVar11 = uVar11 & 0xffffffff;
    for (uVar5 = 0;
        begin._M_current =
             (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start, uVar11 != uVar5; uVar5 = uVar5 + 1) {
      coverflag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[begin._M_current[uVar5]] = '\x01';
    }
    end._M_current =
         (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_finish;
    if (begin._M_current != end._M_current) {
      bad_allowed = pdqsort_detail::log2<long>((long)end._M_current - (long)begin._M_current >> 2);
      pdqsort_detail::
      pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedBinaryCover()::__0,true>
                (begin,end,(anon_class_8_1_8991fb9c)this,bad_allowed,true);
    }
    b = &this->lambda;
    dVar16 = 0.0;
    dVar15 = 0.0;
    for (uVar5 = 0; uVar11 != uVar5; uVar5 = uVar5 + 1) {
      HVar17 = operator-(this->vals
                         [(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar5]],b);
      if (HVar17.hi + HVar17.lo <= this->epsilon) {
        iVar10 = (int)uVar5;
        break;
      }
      dVar1 = this->vals
              [(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5]];
      dVar14 = dVar15 + dVar1;
      dVar16 = dVar16 + (dVar15 - (dVar14 - dVar1)) + (dVar1 - (dVar14 - (dVar14 - dVar1)));
      S.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [uVar5] = dVar14 + dVar16;
      dVar15 = dVar14;
    }
    if (iVar10 != 0) {
      uVar3 = *(uint *)((long)&(this->lambda).hi + 4);
      uVar12 = *(undefined4 *)&(this->lambda).lo;
      uVar4 = *(uint *)((long)&(this->lambda).lo + 4);
      *(undefined4 *)&(this->rhs).hi = *(undefined4 *)&(this->lambda).hi;
      *(uint *)((long)&(this->rhs).hi + 4) = uVar3 ^ 0x80000000;
      *(undefined4 *)&(this->rhs).lo = uVar12;
      *(uint *)((long)&(this->rhs).lo + 4) = uVar4 ^ 0x80000000;
      this->integralSupport = true;
      this->integralCoefficients = false;
      lVar6 = (long)iVar10;
      uVar11 = 0;
      lVar8 = 0;
      if (0 < lVar6) {
        lVar8 = lVar6;
      }
      for (; uVar11 != (uint)this->rowlen; uVar11 = uVar11 + 1) {
        if ((this->isintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar11] == '\0') {
          pdVar2 = this->vals + uVar11;
          if (0.0 < *pdVar2 || *pdVar2 == 0.0) {
            this->vals[uVar11] = 0.0;
          }
          else {
            this->integralSupport = false;
          }
        }
        else {
          pdVar2 = this->vals;
          if (coverflag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar11] == '\0') {
            dVar15 = pdVar2[uVar11];
            for (lVar9 = 0; lVar8 != lVar9; lVar9 = lVar9 + 1) {
              HVar17 = operator-(S.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar9],b);
              if (dVar15 <= HVar17.hi + HVar17.lo) {
                HVar17 = HighsCDouble::operator*(b,(double)(int)lVar9);
                dVar15 = HVar17.lo;
                uVar12 = HVar17.hi._0_4_;
                uVar13 = HVar17.hi._4_4_;
                goto LAB_0029088f;
              }
              if (dVar15 <= S.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar9]) {
                HVar17 = HighsCDouble::operator*(b,(double)((int)lVar9 + 1));
                local_78.lo = HVar17.lo;
                local_98.lo = 0.0;
                local_78.hi = HVar17.hi;
                local_98.hi = dVar15;
                HVar17 = HighsCDouble::operator-
                                   (&local_98,
                                    S.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar9]);
                local_88.lo = HVar17.lo;
                local_88.hi = HVar17.hi;
                HVar17 = HighsCDouble::operator+(&local_78,&local_88);
                dVar15 = HVar17.lo;
                uVar12 = HVar17.hi._0_4_;
                uVar13 = HVar17.hi._4_4_;
                goto LAB_0029088f;
              }
            }
            HVar17 = HighsCDouble::operator*(b,(double)iVar10);
            local_78.lo = HVar17.lo;
            local_98.lo = 0.0;
            local_78.hi = HVar17.hi;
            local_98.hi = dVar15;
            HVar17 = HighsCDouble::operator-
                               (&local_98,
                                S.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar6 + -1]);
            local_88.lo = HVar17.lo;
            local_88.hi = HVar17.hi;
            HVar17 = HighsCDouble::operator+(&local_78,&local_88);
            dVar15 = HVar17.lo;
            uVar12 = HVar17.hi._0_4_;
            uVar13 = HVar17.hi._4_4_;
LAB_0029088f:
            this->vals[uVar11] = (double)CONCAT44(uVar13,uVar12) + dVar15;
          }
          else {
            dVar15 = (this->lambda).hi + (this->lambda).lo;
            if (pdVar2[uVar11] <= dVar15) {
              dVar15 = pdVar2[uVar11];
            }
            pdVar2[uVar11] = dVar15;
            HighsCDouble::operator+=(&this->rhs,dVar15);
          }
        }
      }
      bVar7 = true;
      goto LAB_002908ae;
    }
  }
  bVar7 = false;
LAB_002908ae:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&coverflag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&S.super__Vector_base<double,_std::allocator<double>_>);
  return bVar7;
}

Assistant:

bool HighsCutGeneration::separateLiftedMixedBinaryCover() {
  // initialize indicators
  integralSupport = false;
  integralCoefficients = false;

  HighsInt coversize = cover.size();
  std::vector<double> S;
  S.resize(coversize);
  std::vector<uint8_t> coverflag;
  coverflag.resize(rowlen);

  if (coversize == 0) return false;

  for (HighsInt i = 0; i != coversize; ++i) coverflag[cover[i]] = 1;

  pdqsort_branchless(cover.begin(), cover.end(),
                     [&](HighsInt a, HighsInt b) { return vals[a] > vals[b]; });
  HighsCDouble sum = 0;

  HighsInt p = coversize;
  for (HighsInt i = 0; i != coversize; ++i) {
    if (vals[cover[i]] - lambda <= epsilon) {
      p = i;
      break;
    }
    sum += vals[cover[i]];
    S[i] = double(sum);
  }
  if (p == 0) return false;
  /* define the lifting function */
  auto phi = [&](double a) {
    for (HighsInt i = 0; i < p; ++i) {
      if (a <= S[i] - lambda) return double(i * lambda);

      if (a <= S[i]) return double((i + 1) * lambda + (HighsCDouble(a) - S[i]));
    }

    return double(p * lambda + (HighsCDouble(a) - S[p - 1]));
  };

  rhs = -lambda;

  integralCoefficients = false;
  integralSupport = true;
  for (HighsInt i = 0; i != rowlen; ++i) {
    if (!isintegral[i]) {
      if (vals[i] < 0)
        integralSupport = false;
      else
        vals[i] = 0;
      continue;
    }

    if (coverflag[i]) {
      vals[i] = std::min(vals[i], double(lambda));
      rhs += vals[i];
    } else {
      vals[i] = phi(vals[i]);
    }
  }

  return true;
}